

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MADEC-CORE.cpp
# Opt level: O2

void build_non_adjacent_table
               (vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *edges)

{
  int iVar1;
  int iVar2;
  pointer ppVar3;
  pointer ppVar4;
  int iVar5;
  pair<int,_int> in_RAX;
  void *__s;
  pair<int,_int> pVar6;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *__range1;
  pair<int,_int> *e;
  pointer ppVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  pair<int,_int> local_38;
  
  iVar5 = size;
  uVar8 = (ulong)size;
  local_38 = in_RAX;
  __s = operator_new__((ulong)(uint)(size * size));
  memset(__s,0,uVar8 * uVar8);
  ppVar4 = (edges->super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  ppVar3 = (edges->super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>).
           _M_impl.super__Vector_impl_data._M_start;
  for (ppVar7 = ppVar3; ppVar7 != ppVar4; ppVar7 = ppVar7 + 1) {
    iVar1 = ppVar7->first;
    iVar2 = ppVar7->second;
    *(undefined1 *)((long)__s + (long)(iVar1 * iVar5 + iVar2)) = 1;
    *(undefined1 *)((long)__s + (long)(iVar2 * iVar5 + iVar1)) = 1;
  }
  if (ppVar4 != ppVar3) {
    (edges->super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>)._M_impl.
    super__Vector_impl_data._M_finish = ppVar3;
  }
  lVar10 = 0;
LAB_001184b9:
  lVar9 = lVar10;
  if ((int)uVar8 <= lVar10) {
    operator_delete__(__s);
    build_adjacent_table(edges,&NAdjB,NAdjP);
    return;
  }
  do {
    pVar6 = (pair<int,_int>)((lVar9 << 0x20) + lVar10);
    do {
      iVar5 = (int)lVar9;
      if ((int)uVar8 <= iVar5 + 1) {
        lVar10 = lVar10 + 1;
        goto LAB_001184b9;
      }
      pVar6 = (pair<int,_int>)((long)pVar6 + 0x100000000);
      lVar9 = lVar9 + 1;
    } while (*(char *)((long)__s + (long)((int)lVar10 * (int)uVar8 + 1 + iVar5)) != '\0');
    local_38 = pVar6;
    std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
    emplace_back<std::pair<int,int>>
              ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)edges,&local_38);
    uVar8 = (ulong)(uint)size;
  } while( true );
}

Assistant:

void build_non_adjacent_table(vector<pair<int, int> > edges) {
    bool *graph = new bool[size * size];
    memset(graph, 0, sizeof(bool) * size * size);
    for (auto &e: edges) {
        graph[e.first * size + e.second] = true;
        graph[e.second * size + e.first] = true;
    }
    edges.clear();
    for (int i = 0; i < size; ++i) 
        for (int j = i+1; j < size; ++j) if (!graph[i * size + j]) {
            edges.push_back(make_pair(i, j));
        }
    delete[] graph;
    build_adjacent_table(edges, &NAdjB, NAdjP);
}